

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void dwt1(wt_object wt,double *sig,int len_sig,double *cA,double *cD)

{
  int iVar1;
  int iVar2;
  int iVar3;
  conv_object pcVar4;
  double *x;
  char *__format;
  int iVar5;
  wave_object pwVar6;
  int iVar7;
  double *local_48;
  double *local_40;
  
  iVar3 = wt->wave->lpd_len;
  iVar5 = wt->wave->hpd_len + iVar3;
  iVar7 = iVar5 / 2;
  iVar1 = strcmp(wt->ext,"per");
  if (iVar1 == 0) {
    local_40 = (double *)malloc((long)(len_sig % 2 + len_sig + iVar7) << 3);
    iVar1 = per_ext(sig,len_sig,iVar5 / 4,local_40);
    iVar5 = iVar1 + iVar7;
    pwVar6 = wt->wave;
    iVar3 = pwVar6->lpd_len;
    local_48 = (double *)malloc((long)(iVar5 + iVar3 + -1) << 3);
    if (iVar3 == pwVar6->hpd_len) {
      iVar2 = strcmp(wt->cmethod,"fft");
      if ((iVar2 == 0) || (iVar2 = strcmp(wt->cmethod,"FFT"), iVar2 == 0)) {
        pcVar4 = conv_init(iVar5,iVar3);
        wt->cobj = pcVar4;
        wt->cfftset = 1;
        pwVar6 = wt->wave;
        iVar3 = pwVar6->lpd_len;
      }
      wconv(wt,local_40,iVar5,pwVar6->lpd,iVar3,local_48);
      x = local_48 + iVar7;
      downsamp(x,iVar1,2,cA);
      wconv(wt,local_40,iVar5,wt->wave->hpd,wt->wave->hpd_len,local_48);
LAB_001032ed:
      downsamp(x,iVar1,2,cD);
      if (wt->wave->lpd_len == wt->wave->hpd_len) {
        iVar3 = strcmp(wt->cmethod,"fft");
        if ((iVar3 == 0) || (iVar3 = strcmp(wt->cmethod,"FFT"), iVar3 == 0)) {
          free_conv(wt->cobj);
          wt->cfftset = 0;
        }
      }
      free(local_40);
      free(local_48);
      return;
    }
  }
  else {
    iVar1 = strcmp(wt->ext,"sym");
    if (iVar1 != 0) {
      __format = "Signal extension can be either per or sym";
      goto LAB_0010336b;
    }
    local_40 = (double *)malloc((long)(len_sig + iVar3 * 2 + -2) << 3);
    iVar5 = symm_ext(sig,len_sig,iVar3 + -1,local_40);
    local_48 = (double *)malloc((long)((iVar3 + -1) * 3 + iVar5) << 3);
    pwVar6 = wt->wave;
    iVar1 = pwVar6->lpd_len;
    if (iVar1 == pwVar6->hpd_len) {
      iVar7 = iVar3 * 2 + -2;
      iVar2 = strcmp(wt->cmethod,"fft");
      if ((iVar2 == 0) || (iVar2 = strcmp(wt->cmethod,"FFT"), iVar2 == 0)) {
        pcVar4 = conv_init(iVar7 + iVar5,iVar3);
        wt->cobj = pcVar4;
        wt->cfftset = 1;
        pwVar6 = wt->wave;
        iVar1 = pwVar6->lpd_len;
      }
      iVar7 = iVar7 + iVar5;
      wconv(wt,local_40,iVar7,pwVar6->lpd,iVar1,local_48);
      x = local_48 + iVar3;
      iVar1 = iVar3 + iVar5 + -2;
      downsamp(x,iVar1,2,cA);
      wconv(wt,local_40,iVar7,wt->wave->hpd,wt->wave->hpd_len,local_48);
      goto LAB_001032ed;
    }
  }
  __format = "Decomposition Filters must have the same length.";
LAB_0010336b:
  printf(__format);
  exit(-1);
}

Assistant:

static void dwt1(wt_object wt,double *sig,int len_sig, double *cA, double *cD) {
	int len_avg,D,lf;
	double *signal,*cA_undec;
	len_avg = (wt->wave->lpd_len + wt->wave->hpd_len) / 2;
	//len_sig = 2 * (int)ceil((double)len_sig / 2.0);

	D = 2;

	if (!strcmp(wt->ext, "per")) {
		signal = (double*)malloc(sizeof(double)* (len_sig + len_avg + (len_sig % 2)));

		len_sig = per_ext(sig, len_sig, len_avg / 2, signal);

		cA_undec = (double*)malloc(sizeof(double)* (len_sig + len_avg + wt->wave->lpd_len - 1));

		if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
			wt->cobj = conv_init(len_sig + len_avg, wt->wave->lpd_len);
			wt->cfftset = 1;
		}
		else if (!(wt->wave->lpd_len == wt->wave->hpd_len)) {
			printf("Decomposition Filters must have the same length.");
			exit(-1);
		}

		wconv(wt, signal, len_sig + len_avg, wt->wave->lpd, wt->wave->lpd_len, cA_undec);

		downsamp(cA_undec + len_avg, len_sig, D, cA);

		wconv(wt, signal, len_sig + len_avg, wt->wave->hpd, wt->wave->hpd_len, cA_undec);

		downsamp(cA_undec + len_avg, len_sig, D, cD);
	}
	else if (!strcmp(wt->ext, "sym")) {
		//printf("\n YES %s \n", wt->ext);
		lf = wt->wave->lpd_len;// lpd and hpd have the same length

		signal = (double*)malloc(sizeof(double)* (len_sig + 2 * (lf - 1)));

		len_sig = symm_ext(sig, len_sig, lf - 1, signal);

		cA_undec = (double*)malloc(sizeof(double)* (len_sig + 3 * (lf - 1)));

		if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
			wt->cobj = conv_init(len_sig + 2 * (lf - 1), lf);
			wt->cfftset = 1;
		}
		else if (!(wt->wave->lpd_len == wt->wave->hpd_len)) {
			printf("Decomposition Filters must have the same length.");
			exit(-1);
		}


		wconv(wt, signal, len_sig + 2 * (lf - 1), wt->wave->lpd, wt->wave->lpd_len, cA_undec);

		downsamp(cA_undec + lf, len_sig + lf - 2, D, cA);

		wconv(wt, signal, len_sig + 2 * (lf - 1), wt->wave->hpd, wt->wave->hpd_len, cA_undec);

		downsamp(cA_undec + lf, len_sig + lf - 2, D, cD);
	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}


	if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
		free_conv(wt->cobj);
		wt->cfftset = 0;
	}

	free(signal);
	free(cA_undec);
}